

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O1

void __thiscall QOpenGLWidget::QOpenGLWidget(QOpenGLWidget *this,QWidget *parent,WindowFlags f)

{
  QWidgetPrivate *pQVar1;
  char cVar2;
  QWidgetPrivate *pQVar3;
  QOpenGLWidget *this_00;
  
  pQVar3 = (QWidgetPrivate *)operator_new(0x2c0);
  QWidgetPrivate::QWidgetPrivate(pQVar3,0x60a00);
  *(undefined ***)pQVar3 = &PTR__QOpenGLWidgetPrivate_0010d788;
  *(undefined8 *)(pQVar3 + 600) = 0;
  *(undefined8 *)(pQVar3 + 0x260) = 0;
  *(undefined8 *)(pQVar3 + 0x268) = 0;
  *(undefined8 *)(pQVar3 + 0x270) = 0;
  *(undefined8 *)(pQVar3 + 0x278) = 0;
  *(undefined8 *)(pQVar3 + 0x280) = 0;
  *(undefined8 *)(pQVar3 + 0x288) = 0;
  *(undefined8 *)(pQVar3 + 0x290) = 0;
  *(undefined8 *)(pQVar3 + 0x298) = 0;
  *(undefined8 *)(pQVar3 + 0x2a0) = 0;
  QSurfaceFormat::defaultFormat();
  *(undefined4 *)(pQVar3 + 0x2b7) = 0;
  *(undefined8 *)(pQVar3 + 0x2b0) = 0;
  QWidget::QWidget(&this->super_QWidget,pQVar3,parent,
                   f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i);
  *(undefined ***)this = &PTR_metaObject_0010d448;
  *(undefined ***)&this->field_0x10 = &PTR__QOpenGLWidget_0010d610;
  pQVar3 = *(QWidgetPrivate **)&this->field_0x8;
  this_00 = QGuiApplicationPrivate::platform_integration;
  cVar2 = (**(code **)(*(long *)QGuiApplicationPrivate::platform_integration + 0x10))
                    (QGuiApplicationPrivate::platform_integration,0x17);
  if (cVar2 != '\0') {
    this_00 = QGuiApplicationPrivate::platform_integration;
    cVar2 = (**(code **)(*(long *)QGuiApplicationPrivate::platform_integration + 0x10))
                      (QGuiApplicationPrivate::platform_integration,2);
    if (cVar2 != '\0') {
      pQVar1 = pQVar3 + 0x253;
      *pQVar1 = (QWidgetPrivate)((byte)*pQVar1 | 1);
      QWidgetPrivate::setTextureChildSeen(pQVar3);
      return;
    }
  }
  QOpenGLWidget(this_00);
  return;
}

Assistant:

QOpenGLWidget::QOpenGLWidget(QWidget *parent, Qt::WindowFlags f)
    : QWidget(*(new QOpenGLWidgetPrivate), parent, f)
{
    Q_D(QOpenGLWidget);
    if (Q_UNLIKELY(!QGuiApplicationPrivate::platformIntegration()->hasCapability(QPlatformIntegration::RhiBasedRendering)
                   || !QGuiApplicationPrivate::platformIntegration()->hasCapability(QPlatformIntegration::OpenGL)))
        qWarning("QOpenGLWidget is not supported on this platform.");
    else
        d->setRenderToTexture();
}